

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# locavailable.cpp
# Opt level: O0

void loadInstalledLocales(void)

{
  UBool UVar1;
  int32_t iVar2;
  int local_e0;
  int32_t localeCount;
  int32_t i;
  UErrorCode status;
  UResourceBundle installed;
  UResourceBundle *indexLocale;
  
  installed.fSize = 0;
  installed._196_4_ = 0;
  localeCount = 0;
  local_e0 = 0;
  _installedLocalesCount = 0;
  ures_initStackObject_63((UResourceBundle *)&i);
  installed._192_8_ = ures_openDirect_63((char *)0x0,"res_index",&localeCount);
  ures_getByKey_63((UResourceBundle *)installed._192_8_,"InstalledLocales",(UResourceBundle *)&i,
                   &localeCount);
  UVar1 = U_SUCCESS(localeCount);
  if (UVar1 != '\0') {
    iVar2 = ures_getSize_63((UResourceBundle *)&i);
    _installedLocales = (char **)uprv_malloc_63((long)(iVar2 + 1) << 3);
    if (_installedLocales != (char **)0x0) {
      ures_resetIterator_63((UResourceBundle *)&i);
      while (UVar1 = ures_hasNext_63((UResourceBundle *)&i), UVar1 != '\0') {
        ures_getNextString_63
                  ((UResourceBundle *)&i,(int32_t *)0x0,_installedLocales + local_e0,&localeCount);
        local_e0 = local_e0 + 1;
      }
      _installedLocales[local_e0] = (char *)0x0;
      _installedLocalesCount = iVar2;
      ucln_common_registerCleanup_63(UCLN_COMMON_ULOC,uloc_cleanup);
    }
  }
  ures_close_63((UResourceBundle *)&i);
  ures_close_63((UResourceBundle *)installed._192_8_);
  return;
}

Assistant:

static void U_CALLCONV loadInstalledLocales() {
    UResourceBundle *indexLocale = NULL;
    UResourceBundle installed;
    UErrorCode status = U_ZERO_ERROR;
    int32_t i = 0;
    int32_t localeCount;
    
    U_ASSERT(_installedLocales == NULL);
    U_ASSERT(_installedLocalesCount == 0);

    _installedLocalesCount = 0;
    ures_initStackObject(&installed);
    indexLocale = ures_openDirect(NULL, _kIndexLocaleName, &status);
    ures_getByKey(indexLocale, _kIndexTag, &installed, &status);
    
    if(U_SUCCESS(status)) {
        localeCount = ures_getSize(&installed);
        _installedLocales = (char **) uprv_malloc(sizeof(char*) * (localeCount+1));
        if (_installedLocales != NULL) {
            ures_resetIterator(&installed);
            while(ures_hasNext(&installed)) {
                ures_getNextString(&installed, NULL, (const char **)&_installedLocales[i++], &status);
            }
            _installedLocales[i] = NULL;
            _installedLocalesCount = localeCount;
            ucln_common_registerCleanup(UCLN_COMMON_ULOC, uloc_cleanup);
        }
    }
    ures_close(&installed);
    ures_close(indexLocale);
}